

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::GeometryHelper_Extend_PointToLine
          (X3DImporter *this,list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pPoint,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pLine)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  undefined8 extraout_RAX;
  X3DImporter *this_00;
  _Self __tmp;
  _List_node_base *p_Var5;
  undefined1 local_40 [32];
  
  if (1 < (pPoint->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
          ._M_node._M_size) {
    p_Var4 = (pPoint->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl._M_node.super__List_node_base._M_prev;
    p_Var3 = (pPoint->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    p_Var5 = p_Var3->_M_next;
    p_Var2 = (_List_node_base *)operator_new(0x20);
    p_Var2[1]._M_next = p_Var3[1]._M_next;
    *(undefined4 *)&p_Var2[1]._M_prev = *(undefined4 *)&p_Var3[1]._M_prev;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    psVar1 = &(pLine->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    for (; p_Var5 != p_Var4; p_Var5 = p_Var5->_M_next) {
      p_Var3 = (_List_node_base *)operator_new(0x20);
      p_Var3[1]._M_next = p_Var5[1]._M_next;
      *(undefined4 *)&p_Var3[1]._M_prev = *(undefined4 *)&p_Var5[1]._M_prev;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(pLine->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      p_Var3 = (_List_node_base *)operator_new(0x20);
      p_Var3[1]._M_next = p_Var5[1]._M_next;
      *(undefined4 *)&p_Var3[1]._M_prev = *(undefined4 *)&p_Var5[1]._M_prev;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(pLine->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var4 = (_List_node_base *)operator_new(0x20);
    p_Var4[1]._M_next = p_Var5[1]._M_next;
    *(undefined4 *)&p_Var4[1]._M_prev = *(undefined4 *)&p_Var5[1]._M_prev;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    psVar1 = &(pLine->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    return;
  }
  this_00 = (X3DImporter *)local_40;
  local_40._0_8_ = local_40 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,
             "GeometryHelper_Extend_PointToLine.pPoint.size() can not be less than 2.","");
  Throw_ArgOutOfRange(this_00,(string *)local_40);
  if ((undefined1 *)local_40._0_8_ != local_40 + 0x10) {
    operator_delete((void *)local_40._0_8_);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void X3DImporter::GeometryHelper_Extend_PointToLine(const std::list<aiVector3D>& pPoint, std::list<aiVector3D>& pLine)
{
    std::list<aiVector3D>::const_iterator pit = pPoint.begin();
    std::list<aiVector3D>::const_iterator pit_last = pPoint.end();

	--pit_last;

    if ( pPoint.size() < 2 )
    {
        Throw_ArgOutOfRange( "GeometryHelper_Extend_PointToLine.pPoint.size() can not be less than 2." );
    }

	// add first point of first line.
	pLine.push_back(*pit++);
	// add internal points
	while(pit != pit_last)
	{
		pLine.push_back(*pit);// second point of previous line
		pLine.push_back(*pit);// first point of next line
		++pit;
	}
	// add last point of last line
	pLine.push_back(*pit);
}